

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFArrayBox.cpp
# Opt level: O2

FArrayBox * __thiscall amrex::EBFArrayBox::getBndryAreaData(EBFArrayBox *this)

{
  bool bVar1;
  MultiCutFab *this_00;
  FArrayBox *pFVar2;
  
  if ((this->m_factory != (EBFArrayBoxFactory *)0x0) && (-1 < this->m_box_index)) {
    this_00 = EBFArrayBoxFactory::getBndryArea(this->m_factory);
    bVar1 = MultiCutFab::ok(this_00,this->m_box_index);
    if (bVar1) {
      pFVar2 = &MultiCutFab::operator[](this_00,this->m_box_index)->super_FArrayBox;
      return pFVar2;
    }
  }
  return (FArrayBox *)0x0;
}

Assistant:

const FArrayBox*
EBFArrayBox::getBndryAreaData () const
{
    if (m_factory && m_box_index >= 0) {
        MultiCutFab const& mf = m_factory->getBndryArea();
        if (mf.ok(m_box_index)) {
            return &(mf[m_box_index]);
        } else {
            return nullptr;
        }
    } else {
        return nullptr;
    }
}